

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::compFlux
          (MLCellLinOp *this,int amrlev,Array<MultiFab_*,_3> *fluxes,MultiFab *sol,Location loc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FArrayBox *pFVar5;
  uint N;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  _Head_base<0UL,_amrex::MLMGBndry_*,_false> _Var21;
  Box bx;
  undefined4 uStack_29c;
  int local_298;
  int local_294;
  int local_290;
  long local_278;
  Box local_218;
  Box local_1fc;
  Array<FArrayBox_*,_3> pflux;
  Elixir elifz;
  Elixir elify;
  Elixir elifx;
  MFIter mfi;
  MFItInfo local_11c;
  Array<FArrayBox,_3> flux;
  
  N = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  _Var21._M_head_impl =
       *(MLMGBndry **)
        &(this->m_bndry_sol).
         super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
         super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>;
  (*(this->super_MLLinOp)._vptr_MLLinOp[0x47])(this,(long)amrlev,0,sol,1,0,_Var21._M_head_impl,0);
  local_11c.num_streams = Gpu::Device::max_gpu_streams;
  local_11c.do_tiling = true;
  local_11c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_11c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_11c.tilesize.vect[2] = DAT_006ddef0;
  local_11c.dynamic = true;
  local_11c.device_sync = true;
  std::array<amrex::FArrayBox,_3UL>::array(&flux);
  pflux._M_elems[1] = flux._M_elems + 1;
  pflux._M_elems[2] = flux._M_elems + 2;
  pflux._M_elems[0] = flux._M_elems;
  MFIter::MFIter(&mfi,(FabArrayBase *)sol,&local_11c);
  uVar6 = (ulong)N;
  if ((int)N < 1) {
    uVar6 = 0;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_1fc,&mfi);
    bx.bigend.vect[2] = local_1fc.bigend.vect[2];
    bx.btype.itype = local_1fc.btype.itype;
    bx.smallend.vect[0] = local_1fc.smallend.vect[0];
    bx.smallend.vect[1] = local_1fc.smallend.vect[1];
    bx.bigend.vect[0] = local_1fc.bigend.vect[0];
    if ((local_1fc._20_8_ & 0x100000000) == 0) {
      bx.bigend.vect[0] = local_1fc.bigend.vect[0] + 1;
      bx.btype.itype = bx.btype.itype | 1;
    }
    FArrayBox::resize(flux._M_elems,&bx,N,(Arena *)0x0);
    bx.bigend.vect[1] = local_1fc.bigend.vect[1];
    bx.bigend.vect[2] = local_1fc.bigend.vect[2];
    bx.btype.itype = local_1fc.btype.itype;
    bx.smallend.vect[0] = local_1fc.smallend.vect[0];
    bx.smallend.vect[1] = local_1fc.smallend.vect[1];
    if ((local_1fc._20_8_ & 0x200000000) == 0) {
      bx.bigend.vect[1] = local_1fc.bigend.vect[1] + 1;
      bx.btype.itype = bx.btype.itype | 2;
    }
    FArrayBox::resize(flux._M_elems + 1,&bx,N,(Arena *)0x0);
    bx.bigend.vect[1] = local_1fc.bigend.vect[1];
    bx.bigend.vect[2] = local_1fc.bigend.vect[2];
    bx.btype.itype = local_1fc.btype.itype;
    bx.smallend.vect[0] = local_1fc.smallend.vect[0];
    bx.smallend.vect[1] = local_1fc.smallend.vect[1];
    bx.smallend.vect[2] = local_1fc.smallend.vect[2];
    bx.bigend.vect[0] = local_1fc.bigend.vect[0];
    if ((local_1fc._20_8_ & 0x400000000) == 0) {
      bx.bigend.vect[2] = bx.bigend.vect[2] + 1;
      bx.btype.itype = bx.btype.itype | 4;
    }
    FArrayBox::resize((FArrayBox *)&flux._M_elems[2].super_BaseFab<double>,&bx,N,(Arena *)0x0);
    BaseFab<double>::elixir<double,_0>(&elifx,(BaseFab<double> *)&flux);
    BaseFab<double>::elixir<double,_0>(&elify,&flux._M_elems[1].super_BaseFab<double>);
    BaseFab<double>::elixir<double,_0>(&elifz,&flux._M_elems[2].super_BaseFab<double>);
    piVar7 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    _Var21._M_head_impl = (MLMGBndry *)((ulong)_Var21._M_head_impl & 0xffffffff00000000);
    (*(this->super_MLLinOp)._vptr_MLLinOp[0x4a])
              (this,(ulong)(uint)amrlev,&mfi,&pflux,
               (sol->super_FabArray<amrex::FArrayBox>).m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar7],(ulong)loc,_Var21._M_head_impl);
    for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
      MFIter::nodaltilebox(&local_218,&mfi,(int)lVar20);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&bx,&fluxes->_M_elems[lVar20]->super_FabArray<amrex::FArrayBox>,
                 &mfi);
      pFVar5 = pflux._M_elems[lVar20];
      iVar1 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
      iVar2 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
      iVar3 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
      iVar4 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2];
      lVar8 = (long)(((pFVar5->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
      lVar18 = (long)(((pFVar5->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
      lVar9 = (long)local_218.smallend.vect[1];
      lVar15 = (lVar9 * 8 + ((long)local_218.smallend.vect[2] - (long)iVar3) * lVar18 * 8 +
               (long)iVar2 * -8) * lVar8 + (long)local_218.smallend.vect[0] * 8 + (long)iVar1 * -8 +
               (long)(pFVar5->super_BaseFab<double>).dptr;
      lVar18 = lVar18 * lVar8 * 8;
      local_278 = 0;
      for (uVar19 = 0; lVar13 = (long)local_218.smallend.vect[2], lVar16 = lVar15, uVar19 != uVar6;
          uVar19 = uVar19 + 1) {
        for (; lVar13 <= local_218.bigend.vect[2]; lVar13 = lVar13 + 1) {
          lVar10 = CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]) * 8;
          lVar17 = CONCAT44(uStack_29c,bx.btype.itype) * local_278 +
                   (lVar9 - local_294) * lVar10 +
                   (lVar13 - local_290) * CONCAT44(bx.bigend.vect[2],bx.bigend.vect[1]) * 8 +
                   (long)local_298 * -8 +
                   bx.smallend.vect._0_8_ + (long)local_218.smallend.vect[0] * 8;
          lVar11 = lVar16;
          for (lVar12 = lVar9; lVar12 <= local_218.bigend.vect[1]; lVar12 = lVar12 + 1) {
            if (local_218.smallend.vect[0] <= local_218.bigend.vect[0]) {
              lVar14 = 0;
              do {
                *(undefined8 *)(lVar17 + lVar14 * 8) = *(undefined8 *)(lVar11 + lVar14 * 8);
                lVar14 = lVar14 + 1;
              } while ((local_218.bigend.vect[0] - local_218.smallend.vect[0]) + 1 != (int)lVar14);
            }
            lVar11 = lVar11 + lVar8 * 8;
            lVar17 = lVar17 + lVar10;
          }
          lVar16 = lVar16 + lVar18;
        }
        lVar15 = lVar15 + ((iVar4 - iVar3) + 1) * lVar18;
        local_278 = local_278 + 8;
      }
    }
    Gpu::Elixir::~Elixir(&elifz);
    Gpu::Elixir::~Elixir(&elify);
    Gpu::Elixir::~Elixir(&elifx);
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  std::array<amrex::FArrayBox,_3UL>::~array(&flux);
  return;
}

Assistant:

void
MLCellLinOp::compFlux (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& fluxes,
                       MultiFab& sol, Location loc) const
{
    BL_PROFILE("MLCellLinOp::compFlux()");

    const int mglev = 0;
    const int ncomp = getNComp();
    applyBC(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution,
            m_bndry_sol[amrlev].get());

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        Array<FArrayBox,AMREX_SPACEDIM> flux;
        Array<FArrayBox*,AMREX_SPACEDIM> pflux {{ AMREX_D_DECL(&flux[0], &flux[1], &flux[2]) }};
        for (MFIter mfi(sol, mfi_info);  mfi.isValid(); ++mfi)
        {
            const Box& tbx = mfi.tilebox();
            AMREX_D_TERM(flux[0].resize(amrex::surroundingNodes(tbx,0),ncomp);,
                         flux[1].resize(amrex::surroundingNodes(tbx,1),ncomp);,
                         flux[2].resize(amrex::surroundingNodes(tbx,2),ncomp););
            AMREX_D_TERM(Elixir elifx = flux[0].elixir();,
                         Elixir elify = flux[1].elixir();,
                         Elixir elifz = flux[2].elixir(););
            FFlux(amrlev, mfi, pflux, sol[mfi], loc);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                const Box& nbx = mfi.nodaltilebox(idim);
                Array4<Real      > dst = fluxes[idim]->array(mfi);
                Array4<Real const> src =  pflux[idim]->array();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D (nbx, ncomp, i, j, k, n,
                {
                    dst(i,j,k,n) = src(i,j,k,n);
                });
            }
        }
    }
}